

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.h
# Opt level: O0

SVectorBase<double> * __thiscall
soplex::SPxSolverBase<double>::vector(SPxSolverBase<double> *this,SPxRowId *rid)

{
  Representation RVar1;
  SPxSolverBase<double> *in_RDI;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  SPxLPBase<double> *in_stack_ffffffffffffffd0;
  Array<soplex::UnitVectorBase<double>_> *this_00;
  UnitVectorBase<double> *local_20;
  
  RVar1 = rep(in_RDI);
  if (RVar1 == ROW) {
    SPxLPBase<double>::number
              (in_stack_ffffffffffffffd0,
               (SPxRowId *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    local_20 = (UnitVectorBase<double> *)
               SVSetBase<double>::operator[]
                         ((SVSetBase<double> *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  }
  else {
    this_00 = &in_RDI->unitVecs;
    SPxLPBase<double>::number
              ((SPxLPBase<double> *)this_00,
               (SPxRowId *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    local_20 = Array<soplex::UnitVectorBase<double>_>::operator[](this_00,in_stack_ffffffffffffffcc)
    ;
  }
  return &local_20->super_SVectorBase<double>;
}

Assistant:

const SVectorBase<R>& vector(const SPxRowId& rid) const
   {
      assert(rid.isValid());
      return (rep() == ROW)
             ? (*thevectors)[this->number(rid)]
             : static_cast<const SVectorBase<R>&>(unitVecs[this->number(rid)]);
   }